

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O3

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
* phyr::RenderConfig::createSupportedConfigMap_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *in_RDI;
  ParamType local_3c;
  key_type local_38;
  
  *(_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    **)in_RDI = in_RDI + 0x30;
  *(undefined8 *)(in_RDI + 8) = 1;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0x3f800000;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"resolution","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](in_RDI,&local_38);
  local_3c = INT;
  iVar2._M_current =
       (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::
    _M_realloc_insert<phyr::ParamType>(pmVar3,iVar2,&local_3c);
  }
  else {
    *iVar2._M_current = INT;
    (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"resolution","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](in_RDI,&local_38);
  local_3c = INT;
  iVar2._M_current =
       (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::
    _M_realloc_insert<phyr::ParamType>(pmVar3,iVar2,&local_3c);
  }
  else {
    *iVar2._M_current = INT;
    (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"samples","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](in_RDI,&local_38);
  local_3c = INT;
  iVar2._M_current =
       (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::
    _M_realloc_insert<phyr::ParamType>(pmVar3,iVar2,&local_3c);
  }
  else {
    *iVar2._M_current = INT;
    (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bounces","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](in_RDI,&local_38);
  local_3c = INT;
  iVar2._M_current =
       (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::
    _M_realloc_insert<phyr::ParamType>(pmVar3,iVar2,&local_3c);
  }
  else {
    *iVar2._M_current = INT;
    (pmVar3->super__Vector_base<phyr::ParamType,_std::allocator<phyr::ParamType>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
          *)in_RDI;
}

Assistant:

static std::unordered_map<std::string, std::vector<ParamType>> createSupportedConfigMap() {
        std::unordered_map<std::string, std::vector<ParamType>> config;
        // Image resolution
        config["resolution"].push_back(ParamType::INT);
        config["resolution"].push_back(ParamType::INT);

        // Samples per pixel
        config["samples"].push_back(ParamType::INT);

        // Max-bounces
        config["bounces"].push_back(ParamType::INT);
        return config;
    }